

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types_wrapper.h
# Opt level: O3

void __thiscall
Am_Font_Data::Am_Font_Data
          (Am_Font_Data *this,Am_Font_Family_Flag f,bool is_bold,bool is_italic,bool is_underline,
          Am_Font_Size_Flag s)

{
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002e3738;
  this->family = f;
  this->bold = is_bold;
  this->italic = is_italic;
  this->underline = is_underline;
  this->size = s;
  this->name = (char *)0x0;
  this->char_width = 0;
  this->main_xfont = (XFontStruct *)0x0;
  this->main_display = (Display *)0x0;
  this->font_head = (Font_Index *)0x0;
  this->next = list;
  list = this;
  return;
}

Assistant:

Am_Wrapper(const Am_Wrapper &) : refs(1) { ; }